

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
::operator()(gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
             *this,double *blockB,blas_data_mapper<double,_long,_0,_0,_1> *rhs,long depth,long cols,
            long stride,long offset)

{
  double *pdVar1;
  double *pdVar2;
  long local_288;
  long k_1;
  LinearMapper dm0_1;
  long j2_1;
  long k;
  LinearMapper dm3;
  LinearMapper dm2;
  LinearMapper dm1;
  LinearMapper dm0;
  long j2;
  long peeled_k;
  long count;
  long packet_cols4;
  long packet_cols8;
  long lStack_218;
  conj_if<false> cj;
  long stride_local;
  long cols_local;
  long depth_local;
  blas_data_mapper<double,_long,_0,_0,_1> *rhs_local;
  double *blockB_local;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  *this_local;
  undefined1 local_1d0 [8];
  double *local_1c8;
  undefined8 local_1c0;
  blas_data_mapper<double,_long,_0,_0,_1> *local_1b8;
  long local_1b0;
  undefined8 local_1a8;
  blas_data_mapper<double,_long,_0,_0,_1> *local_1a0;
  undefined1 local_198 [8];
  long local_190;
  undefined8 local_188;
  blas_data_mapper<double,_long,_0,_0,_1> *local_180;
  long local_178;
  undefined8 local_170;
  blas_data_mapper<double,_long,_0,_0,_1> *local_168;
  undefined1 local_160 [8];
  long local_158;
  undefined8 local_150;
  blas_data_mapper<double,_long,_0,_0,_1> *local_148;
  long local_140;
  undefined8 local_138;
  blas_data_mapper<double,_long,_0,_0,_1> *local_130;
  undefined1 local_128 [8];
  long local_120;
  undefined8 local_118;
  blas_data_mapper<double,_long,_0,_0,_1> *local_110;
  double *local_108;
  undefined8 local_100;
  blas_data_mapper<double,_long,_0,_0,_1> *local_f8;
  undefined1 local_f0 [8];
  double *local_e8;
  undefined8 local_e0;
  blas_data_mapper<double,_long,_0,_0,_1> *local_d8;
  long local_d0;
  long *local_c8;
  long local_c0;
  long *local_b8;
  long local_b0;
  LinearMapper *local_a8;
  long local_a0;
  LinearMapper *local_98;
  long local_90;
  LinearMapper *local_88;
  undefined8 local_80;
  double *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  double *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  double *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  double *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  double *local_18;
  undefined1 *local_10;
  
  lStack_218 = stride;
  ignore_unused_variable<long>(&stack0xfffffffffffffde8);
  ignore_unused_variable<long>(&offset);
  if (depth <= lStack_218 && offset <= lStack_218) {
    pdVar1 = (double *)(cols / 4 << 2);
    peeled_k = 0;
    for (dm0.m_data = (double *)0x0; dm0_1.m_data = pdVar1, (long)dm0.m_data < (long)pdVar1;
        dm0.m_data = dm0.m_data + 4) {
      peeled_k = offset * 4 + peeled_k;
      local_100 = 0;
      local_108 = dm0.m_data;
      local_e0 = 0;
      local_e8 = dm0.m_data;
      dm1.m_data = rhs->m_data + (long)dm0.m_data * rhs->m_stride;
      local_70 = local_f0;
      local_80 = 1;
      local_140 = (long)dm0.m_data + 1;
      local_138 = 0;
      local_118 = 0;
      dm2.m_data = rhs->m_data + local_140 * rhs->m_stride;
      local_58 = local_128;
      local_68 = 1;
      local_178 = (long)dm0.m_data + 2;
      local_170 = 0;
      local_150 = 0;
      dm3.m_data = rhs->m_data + local_178 * rhs->m_stride;
      local_40 = local_160;
      local_50 = 1;
      local_1b0 = (long)dm0.m_data + 3;
      local_1a8 = 0;
      local_188 = 0;
      k = (long)(rhs->m_data + local_1b0 * rhs->m_stride);
      local_28 = local_198;
      local_38 = 1;
      local_1a0 = rhs;
      local_190 = local_1b0;
      local_180 = rhs;
      local_168 = rhs;
      local_158 = local_178;
      local_148 = rhs;
      local_130 = rhs;
      local_120 = local_140;
      local_110 = rhs;
      local_f8 = rhs;
      local_d8 = rhs;
      local_78 = dm1.m_data;
      local_60 = dm2.m_data;
      local_48 = dm3.m_data;
      local_30 = (double *)k;
      for (j2_1 = 0; j2_1 < depth; j2_1 = j2_1 + 1) {
        local_88 = &dm1;
        local_90 = j2_1;
        pdVar2 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),dm1.m_data + j2_1);
        blockB[peeled_k] = *pdVar2;
        local_98 = &dm2;
        local_a0 = j2_1;
        pdVar2 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),dm2.m_data + j2_1);
        blockB[peeled_k + 1] = *pdVar2;
        local_a8 = &dm3;
        local_b0 = j2_1;
        pdVar2 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),dm3.m_data + j2_1);
        blockB[peeled_k + 2] = *pdVar2;
        local_b8 = &k;
        local_c0 = j2_1;
        pdVar2 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),(double *)(k + j2_1 * 8));
        blockB[peeled_k + 3] = *pdVar2;
        peeled_k = peeled_k + 4;
      }
      peeled_k = ((lStack_218 - offset) - depth) * 4 + peeled_k;
    }
    for (; (long)dm0_1.m_data < cols; dm0_1.m_data = dm0_1.m_data + 1) {
      peeled_k = offset + peeled_k;
      local_1c0 = 0;
      local_1c8 = dm0_1.m_data;
      k_1 = (long)(rhs->m_data + (long)dm0_1.m_data * rhs->m_stride);
      local_10 = local_1d0;
      local_20 = 1;
      local_1b8 = rhs;
      local_18 = (double *)k_1;
      for (local_288 = 0; local_288 < depth; local_288 = local_288 + 1) {
        local_c8 = &k_1;
        local_d0 = local_288;
        pdVar1 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),
                            (double *)(k_1 + local_288 * 8));
        blockB[peeled_k] = *pdVar1;
        peeled_k = peeled_k + 1;
      }
      peeled_k = ((lStack_218 - offset) - depth) + peeled_k;
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x958,
                "void Eigen::internal::gemm_pack_rhs<double, long, Eigen::internal::blas_data_mapper<double, long, 0>, 4, 0, false, true>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::blas_data_mapper<double, long, 0>, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = true]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;
  const Index peeled_k = (depth/PacketSize)*PacketSize;
//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       const Scalar* b0 = &rhs[(j2+0)*rhsStride];
//       const Scalar* b1 = &rhs[(j2+1)*rhsStride];
//       const Scalar* b2 = &rhs[(j2+2)*rhsStride];
//       const Scalar* b3 = &rhs[(j2+3)*rhsStride];
//       const Scalar* b4 = &rhs[(j2+4)*rhsStride];
//       const Scalar* b5 = &rhs[(j2+5)*rhsStride];
//       const Scalar* b6 = &rhs[(j2+6)*rhsStride];
//       const Scalar* b7 = &rhs[(j2+7)*rhsStride];
//       Index k=0;
//       if(PacketSize==8) // TODO enable vectorized transposition for PacketSize==4
//       {
//         for(; k<peeled_k; k+=PacketSize) {
//           PacketBlock<Packet> kernel;
//           for (int p = 0; p < PacketSize; ++p) {
//             kernel.packet[p] = ploadu<Packet>(&rhs[(j2+p)*rhsStride+k]);
//           }
//           ptranspose(kernel);
//           for (int p = 0; p < PacketSize; ++p) {
//             pstoreu(blockB+count, cj.pconj(kernel.packet[p]));
//             count+=PacketSize;
//           }
//         }
//       }
//       for(; k<depth; k++)
//       {
//         blockB[count+0] = cj(b0[k]);
//         blockB[count+1] = cj(b1[k]);
//         blockB[count+2] = cj(b2[k]);
//         blockB[count+3] = cj(b3[k]);
//         blockB[count+4] = cj(b4[k]);
//         blockB[count+5] = cj(b5[k]);
//         blockB[count+6] = cj(b6[k]);
//         blockB[count+7] = cj(b7[k]);
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }

  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      const LinearMapper dm0 = rhs.getLinearMapper(0, j2 + 0);
      const LinearMapper dm1 = rhs.getLinearMapper(0, j2 + 1);
      const LinearMapper dm2 = rhs.getLinearMapper(0, j2 + 2);
      const LinearMapper dm3 = rhs.getLinearMapper(0, j2 + 3);

      Index k=0;
      if((PacketSize%4)==0) // TODO enable vectorized transposition for PacketSize==2 ??
      {
        for(; k<peeled_k; k+=PacketSize) {
          PacketBlock<Packet,(PacketSize%4)==0?4:PacketSize> kernel;
          kernel.packet[0           ] = dm0.template loadPacket<Packet>(k);
          kernel.packet[1%PacketSize] = dm1.template loadPacket<Packet>(k);
          kernel.packet[2%PacketSize] = dm2.template loadPacket<Packet>(k);
          kernel.packet[3%PacketSize] = dm3.template loadPacket<Packet>(k);
          ptranspose(kernel);
          pstoreu(blockB+count+0*PacketSize, cj.pconj(kernel.packet[0]));
          pstoreu(blockB+count+1*PacketSize, cj.pconj(kernel.packet[1%PacketSize]));
          pstoreu(blockB+count+2*PacketSize, cj.pconj(kernel.packet[2%PacketSize]));
          pstoreu(blockB+count+3*PacketSize, cj.pconj(kernel.packet[3%PacketSize]));
          count+=4*PacketSize;
        }
      }
      for(; k<depth; k++)
      {
        blockB[count+0] = cj(dm0(k));
        blockB[count+1] = cj(dm1(k));
        blockB[count+2] = cj(dm2(k));
        blockB[count+3] = cj(dm3(k));
        count += 4;
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const LinearMapper dm0 = rhs.getLinearMapper(0, j2);
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(dm0(k));
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}